

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O3

string * __thiscall
gmlc::networking::TcpAcceptor::to_string_abi_cxx11_
          (string *__return_storage_ptr__,TcpAcceptor *this)

{
  ushort uVar1;
  uint __val;
  uint __len;
  string __str;
  undefined1 local_40 [8];
  undefined1 local_38 [24];
  
  local_40[0] = (this->endpoint_).impl_.data_.base.sa_family != 2;
  if ((bool)local_40[0]) {
    local_38._0_8_ = *(size_type *)((long)&(this->endpoint_).impl_.data_ + 8);
    local_38._8_8_ = *(size_type *)((long)&(this->endpoint_).impl_.data_ + 0x10);
    local_38._16_4_ = (this->endpoint_).impl_.data_.v6.sin6_scope_id;
    local_40._4_4_ = 0;
  }
  else {
    local_40._4_4_ = (this->endpoint_).impl_.data_.v6.sin6_flowinfo;
    local_38._0_8_ = 0;
    local_38._8_8_ = 0;
    local_38._16_4_ = 0;
  }
  local_40._1_3_ = 0;
  asio::ip::address::to_string_abi_cxx11_(__return_storage_ptr__,(address *)local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (__return_storage_ptr__,':');
  uVar1 = (this->endpoint_).impl_.data_.v4.sin_port;
  uVar1 = uVar1 << 8 | uVar1 >> 8;
  __val = (uint)uVar1;
  __len = 1;
  if (((9 < uVar1) && (__len = 2, 99 < uVar1)) && (__len = 3, 999 < __val)) {
    __len = 5 - (__val < 10000);
  }
  local_40 = (undefined1  [8])(local_38 + 8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (ulong)__len,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_40,__len,__val);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(char *)local_40,local_38._0_8_);
  if (local_40 != (undefined1  [8])(local_38 + 8)) {
    operator_delete((void *)local_40,local_38._8_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TcpAcceptor::to_string() const
{
    auto str = endpoint_.address().to_string();
    str += ':';
    str += std::to_string(endpoint_.port());
    return str;
}